

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD
               (uint adaptive_subd_display_density,ON_SubD *subd)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = ON_SubD::FaceCount(subd);
  uVar3 = 1;
  if (1 < adaptive_subd_display_density) {
    uVar3 = 4;
    if (adaptive_subd_display_density < 7) {
      uVar3 = adaptive_subd_display_density;
    }
    uVar2 = uVar2 << ((char)uVar3 * '\x02' & 0x1fU);
    if (0x7d000 < uVar2) {
      do {
        uVar3 = uVar3 - 1;
        if (uVar3 < 2) {
          return uVar3;
        }
        bVar1 = 0x1f4003 < uVar2;
        uVar2 = uVar2 >> 2;
      } while (bVar1);
    }
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD(
  unsigned adaptive_subd_display_density,
  const ON_SubD& subd
)
{
  // If this function changes, then a parallel change must be made in
  // ON_SubDLevel::CopyEvaluationCacheForExperts(const ON_SubDLevel& src, ON_SubDHeap& this_heap)
  // so it uses the same automatic density value.
  unsigned int display_density = ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(adaptive_subd_display_density, subd.FaceCount());
  return display_density;
}